

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_post.c
# Opt level: O0

int test_post_number(unsigned_long number)

{
  nhr_request pnVar1;
  size_t sVar2;
  char *textFile;
  unsigned_long number_local;
  
  test_post_request = (nhr_request)nhr_request_create();
  if (number - 1 < 2) {
    nhr_request_set_url(test_post_request,"http","httpbin.org","/post",0x50);
  }
  nhr_request_set_method(test_post_request,2);
  nhr_request_set_timeout(test_post_request,10);
  nhr_request_set_user_object(test_post_request,number);
  nhr_request_add_header_field(test_post_request,"Cache-control","no-cache");
  nhr_request_add_header_field(test_post_request,"Accept-Charset","utf-8");
  nhr_request_add_header_field(test_post_request,"Accept","application/json");
  nhr_request_add_header_field(test_post_request,"Connection","close");
  nhr_request_add_header_field(test_post_request,"User-Agent","CMake tests");
  if (number == 1) {
    nhr_request_add_parameter(test_post_request,"name","Url%20encoded%20name%20value");
  }
  else if (number == 2) {
    nhr_request_add_parameter(test_post_request,"name","Some name");
    pnVar1 = test_post_request;
    sVar2 = strlen(
                  "If the user selected a second (image) file, the user agent might construct the parts as follows"
                  );
    nhr_request_add_data_parameter
              (pnVar1,"text","file1.txt",
               "If the user selected a second (image) file, the user agent might construct the parts as follows"
               ,sVar2);
  }
  nhr_request_set_on_recvd_response(test_post_request,test_post_on_response);
  nhr_request_set_on_error(test_post_request,test_post_on_error);
  test_post_working = nhr_request_send(test_post_request);
  if (test_post_working == '\0') {
    test_post_error = 4;
  }
  else {
    test_post_error = 0;
  }
  while (test_post_working != '\0') {
    nhr_thread_sleep(0x14);
  }
  nhr_thread_sleep(0x342);
  return test_post_error;
}

Assistant:

static int test_post_number(unsigned long number) {

	test_post_request = nhr_request_create();

	switch (number) {
		case 1:
        case 2:
            nhr_request_set_url(test_post_request, "http", "httpbin.org", "/post", 80); break;
		default:
			break;
	}


	nhr_request_set_method(test_post_request, nhr_method_POST);
	nhr_request_set_timeout(test_post_request, 10);

	nhr_request_set_user_object(test_post_request, (void*)number);

	nhr_request_add_header_field(test_post_request, "Cache-control", "no-cache");
	nhr_request_add_header_field(test_post_request, "Accept-Charset", "utf-8");
	nhr_request_add_header_field(test_post_request, "Accept", "application/json");
	nhr_request_add_header_field(test_post_request, "Connection", "close");
	nhr_request_add_header_field(test_post_request, "User-Agent", "CMake tests");

	switch (number) {
        case 1:
            nhr_request_add_parameter(test_post_request, "name", "Url%20encoded%20name%20value");
			break;
            
#if !defined(NHR_NO_POST_DATA)
        case 2: {
            nhr_request_add_parameter(test_post_request, "name", "Some name");
            
            const char * textFile = "If the user selected a second (image) file, the user agent might construct the parts as follows";
            nhr_request_add_data_parameter(test_post_request, "text", "file1.txt", textFile, strlen(textFile));
        }
#endif
            
		default:
			break;
	}

	nhr_request_set_on_recvd_response(test_post_request, &test_post_on_response);
	nhr_request_set_on_error(test_post_request, &test_post_on_error);
	test_post_working = nhr_request_send(test_post_request);

	if (test_post_working) test_post_error = 0;
	else test_post_error = 4;

	while (test_post_working) {
		nhr_thread_sleep(20);
	}

	nhr_thread_sleep(834); // just delay between requests

	return test_post_error;
}